

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckMemberFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  string *psVar1;
  char **ppcVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  size_type __n;
  char cVar5;
  bool bVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  long *plVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  char *pcVar19;
  size_type *psVar20;
  pointer pbVar21;
  unsigned_long uVar22;
  char *pos;
  size_t sVar23;
  string buffer;
  string headerfile;
  string classname;
  string functionLine;
  size_t current;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classes;
  ifstream file;
  RegularExpression regex;
  string local_660;
  string local_640;
  string local_620;
  size_t local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  size_t local_578;
  pointer local_570;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  undefined1 local_4c8 [24];
  string local_4b0 [8];
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0 [30];
  string local_2c0;
  string local_2a0;
  string local_280;
  RegularExpression local_260;
  
  this->m_TestsDone[0x1c] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->m_TestsDescription + 0x1c),0,
             (char *)this->m_TestsDescription[0x1c]._M_string_length,0x178dd1);
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x1c));
  if (maxLength != 0) {
    this->m_TestsDone[0x1d] = true;
    psVar1 = this->m_TestsDescription + 0x1d;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)this->m_TestsDescription[0x1d]._M_string_length,0x178e04);
    cVar7 = '\x01';
    if (9 < maxLength) {
      uVar22 = maxLength;
      cVar5 = '\x04';
      do {
        cVar7 = cVar5;
        if (uVar22 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00159f0a;
        }
        if (uVar22 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00159f0a;
        }
        if (uVar22 < 10000) goto LAB_00159f0a;
        bVar6 = 99999 < uVar22;
        uVar22 = uVar22 / 10000;
        cVar5 = cVar7 + '\x04';
      } while (bVar6);
      cVar7 = cVar7 + '\x01';
    }
LAB_00159f0a:
    ppcVar2 = local_260.regmatch.startp + 2;
    local_260.regmatch.startp[0] = (char *)ppcVar2;
    std::__cxx11::string::_M_construct((ulong)&local_260,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_260.regmatch.startp[0],(uint)local_260.regmatch.startp[1],maxLength);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_260.regmatch.startp[0]);
    if ((char **)local_260.regmatch.startp[0] != ppcVar2) {
      operator_delete(local_260.regmatch.startp[0]);
    }
    std::__cxx11::string::append((char *)psVar1);
  }
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (regEx != (char *)0x0) {
    kwssys::RegularExpression::compile(&local_260,regEx);
  }
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_640,(this->m_Filename)._M_dataplus._M_p,(allocator *)&local_660);
  kwssys::SystemTools::GetFilenameExtension((string *)local_4c8,&local_640);
  iVar9 = std::__cxx11::string::compare(local_4c8);
  if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p);
  }
  if (iVar9 != 0) {
    std::__cxx11::string::string
              ((string *)local_4c8,(this->m_Filename)._M_dataplus._M_p,(allocator *)&local_660);
    kwssys::SystemTools::GetFilenamePath(&local_640,(string *)local_4c8);
    if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_);
    }
    std::__cxx11::string::string
              ((string *)&local_660,(this->m_Filename)._M_dataplus._M_p,(allocator *)&local_620);
    kwssys::SystemTools::GetFilenameWithoutExtension((string *)local_4c8,&local_660);
    std::__cxx11::string::_M_append((char *)&local_640,local_4c8._0_8_);
    if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_640);
    bVar6 = kwssys::SystemTools::FileExists(local_640._M_dataplus._M_p);
    if (bVar6) {
      std::ifstream::ifstream(local_4c8);
      std::ifstream::open(local_4c8,(_Ios_Openmode)local_640._M_dataplus._M_p);
      cVar7 = std::__basic_file<char>::is_open();
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cannot open file: ",0x12);
        _Var4._M_p = local_640._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
        }
        else {
          sVar12 = strlen(local_640._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,_Var4._M_p,sVar12);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        cVar7 = '\0';
      }
      else {
        std::istream::seekg((long)local_4c8,_S_beg);
        lVar10 = std::istream::tellg();
        std::istream::seekg((long)local_4c8,_S_beg);
        pcVar11 = (char *)operator_new__(lVar10 + 1);
        std::istream::read(local_4c8,(long)pcVar11);
        pcVar11[lVar10] = '\0';
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        sVar12 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_660,pcVar11,pcVar11 + sVar12);
        std::__cxx11::string::resize((ulong)&local_660,(char)lVar10);
        operator_delete__(pcVar11);
        std::ifstream::close();
        ConvertBufferToWindowsFileType(this,&local_660);
        RemoveComments_abi_cxx11_(&local_620,this,local_660._M_dataplus._M_p);
        std::__cxx11::string::operator=((string *)&local_660,(string *)&local_620);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_280,local_660._M_dataplus._M_p,
                   (char *)(local_660._M_string_length + (long)local_660._M_dataplus._M_p));
        local_600 = CONCAT71(local_600._1_7_,cVar7);
        sVar13 = GetClassPosition(this,0,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        if (sVar13 != 0xffffffffffffffff) {
          do {
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a0,local_660._M_dataplus._M_p,
                       (char *)(local_660._M_string_length + (long)local_660._M_dataplus._M_p));
            FindPreviousWord(&local_620,this,sVar13,false,&local_2a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p);
            }
            if ((local_660._M_dataplus._M_p[sVar13 - 1] != ' ') &&
               ((this->m_BufferNoComment)._M_dataplus._M_p[sVar13 - 1] != '\n')) {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_620,0,(char *)local_620._M_string_length,0x16b513);
              for (sVar23 = sVar13; (sVar23 != 0 && (local_660._M_dataplus._M_p[sVar23 - 1] != ' '))
                  ; sVar23 = sVar23 - 1) {
                std::operator+(&local_5d8,local_660._M_dataplus._M_p[sVar23 - 1],&local_620);
                std::__cxx11::string::operator=((string *)&local_620,(string *)&local_5d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                  operator_delete(local_5d8._M_dataplus._M_p);
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_598,&local_620);
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_568,local_660._M_dataplus._M_p,
                       (char *)(local_660._M_string_length + (long)local_660._M_dataplus._M_p));
            sVar13 = GetClassPosition(this,sVar13 + 1,&local_568);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
          } while (sVar13 != 0xffffffffffffffff);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p);
        }
        cVar7 = (char)local_600;
      }
      std::ifstream::~ifstream(local_4c8);
      if (cVar7 == '\0') {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p != &local_640.field_2) {
          operator_delete(local_640._M_dataplus._M_p);
        }
        bVar6 = true;
        goto LAB_0015b321;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p);
    }
  }
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0);
  sVar13 = GetClassPosition(this,0,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if (sVar13 == 0xffffffffffffffff) {
    bVar8 = 0;
  }
  else {
    psVar1 = &this->m_BufferNoComment;
    bVar8 = 0;
    do {
      local_600 = sVar13 + 1;
      sVar23 = FindEndOfClass(this,local_600);
      FindMemberFunction(&local_640,this,psVar1,sVar13,sVar23,(size_t *)&local_5b8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
      FindPreviousWord(&local_660,this,sVar13,false,&local_4e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      cVar7 = (psVar1->_M_dataplus)._M_p[sVar13 - 1];
      if ((cVar7 != '\n') && (cVar7 != ' ')) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_660,0,(char *)local_660._M_string_length,0x16b513);
        for (; (sVar13 != 0 && (pcVar3 = (psVar1->_M_dataplus)._M_p, pcVar3[sVar13 - 1] != ' '));
            sVar13 = sVar13 - 1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c8,pcVar3[sVar13 - 1],&local_660);
          std::__cxx11::string::operator=((string *)&local_660,(string *)local_4c8);
          if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_);
          }
        }
      }
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"~","");
      std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_660._M_dataplus._M_p);
      pcVar11 = (char *)local_640._M_string_length;
      _Var4._M_p = local_5b8._M_dataplus._M_p;
      while (local_640._M_string_length = (size_type)pcVar11,
            local_5b8._M_dataplus._M_p = _Var4._M_p, _Var4._M_p != (pointer)0xffffffffffffffff) {
        if (((pcVar11 != (char *)local_660._M_string_length) ||
            ((pcVar11 != (char *)0x0 &&
             (iVar9 = bcmp(local_640._M_dataplus._M_p,local_660._M_dataplus._M_p,(size_t)pcVar11),
             iVar9 != 0)))) &&
           ((pcVar11 != (char *)local_620._M_string_length ||
            ((pcVar11 != (char *)0x0 &&
             (iVar9 = bcmp(local_640._M_dataplus._M_p,local_620._M_dataplus._M_p,(size_t)pcVar11),
             iVar9 != 0)))))) {
          bVar6 = kwssys::RegularExpression::find
                            (&local_260,local_640._M_dataplus._M_p,&local_260.regmatch);
          if (!bVar6) {
            local_4b0 = (string  [8])local_4a0;
            local_4a8 = 0;
            local_4a0[0]._M_local_buf[0] = '\0';
            local_4c8._0_8_ = GetLineNumber(this,(size_t)_Var4._M_p,true);
            local_4c8._16_8_ = 0x1c;
            local_4c8._8_8_ = local_4c8._0_8_;
            std::operator+(&local_5f8,"member function (",&local_640);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_5f8);
            psVar20 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_5d8.field_2._M_allocated_capacity = *psVar20;
              local_5d8.field_2._8_8_ = plVar14[3];
              local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
            }
            else {
              local_5d8.field_2._M_allocated_capacity = *psVar20;
              local_5d8._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_5d8._M_string_length = plVar14[1];
            *plVar14 = (long)psVar20;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::__cxx11::string::operator=(local_4b0,(string *)&local_5d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
              operator_delete(local_5d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
              operator_delete(local_5f8._M_dataplus._M_p);
            }
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,(value_type *)local_4c8);
            if (local_4b0 != (string  [8])local_4a0) {
              operator_delete((void *)local_4b0);
            }
            bVar8 = 1;
          }
          if (maxLength != 0) {
            uVar15 = std::__cxx11::string::find((char *)psVar1,0x16acee,(ulong)_Var4._M_p);
            uVar16 = std::__cxx11::string::find((char *)psVar1,0x177d56,(ulong)_Var4._M_p);
            if (uVar15 < uVar16) {
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
              sVar13 = FindClosingChar(this,'{','}',uVar15,true,&local_508);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p);
              }
              lVar10 = GetLineNumber(this,uVar15,false);
              lVar17 = GetLineNumber(this,sVar13,false);
              if ((sVar13 != 0xffffffffffffffff && uVar15 != 0xffffffffffffffff) &&
                 (maxLength < (ulong)(lVar17 - lVar10))) {
                local_4b0 = (string  [8])local_4a0;
                local_4a8 = 0;
                local_4a0[0]._M_local_buf[0] = '\0';
                local_4c8._0_8_ = GetLineNumber(this,(size_t)_Var4._M_p,true);
                local_4c8._16_8_ = 0x1d;
                local_4c8._8_8_ = local_4c8._0_8_;
                std::operator+(&local_5f8,"function (",&local_640);
                puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f8);
                psVar20 = puVar18 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar18 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar20) {
                  local_5d8.field_2._M_allocated_capacity = *psVar20;
                  local_5d8.field_2._8_8_ = puVar18[3];
                  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
                }
                else {
                  local_5d8.field_2._M_allocated_capacity = *psVar20;
                  local_5d8._M_dataplus._M_p = (pointer)*puVar18;
                }
                local_5d8._M_string_length = puVar18[1];
                *puVar18 = psVar20;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                std::__cxx11::string::operator=(local_4b0,(string *)&local_5d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
                  operator_delete(local_5d8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
                  operator_delete(local_5f8._M_dataplus._M_p);
                }
                pcVar11 = (char *)operator_new__(10);
                snprintf(pcVar11,10,"%zd",lVar17 - lVar10);
                std::__cxx11::string::append((char *)local_4b0);
                std::__cxx11::string::append((char *)local_4b0);
                snprintf(pcVar11,10,"%ld",maxLength);
                std::__cxx11::string::append((char *)local_4b0);
                std::__cxx11::string::append((char *)local_4b0);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)local_4c8);
                operator_delete__(pcVar11);
                if (local_4b0 != (string  [8])local_4a0) {
                  operator_delete((void *)local_4b0);
                }
                bVar8 = 1;
              }
            }
          }
        }
        _Var4._M_p = local_5b8._M_dataplus._M_p;
        sVar13 = FindEndOfClass(this,local_600);
        FindMemberFunction((string *)local_4c8,this,psVar1,(size_t)(_Var4._M_p + 1),sVar13,
                           (size_t *)&local_5b8);
        std::__cxx11::string::operator=((string *)&local_640,(string *)local_4c8);
        pcVar11 = (char *)local_640._M_string_length;
        _Var4._M_p = local_5b8._M_dataplus._M_p;
        if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
          operator_delete((void *)local_4c8._0_8_);
          pcVar11 = (char *)local_640._M_string_length;
          _Var4._M_p = local_5b8._M_dataplus._M_p;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_598,&local_660);
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
      sVar13 = GetClassPosition(this,local_600,&local_528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p);
      }
    } while (sVar13 != 0xffffffffffffffff);
  }
  if (local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &this->m_BufferNoComment;
    pbVar21 = local_598.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      pcVar3 = (pbVar21->_M_dataplus)._M_p;
      local_570 = pbVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_640,pcVar3,pcVar3 + pbVar21->_M_string_length);
      for (uVar15 = std::__cxx11::string::find((char *)psVar1,(ulong)local_640._M_dataplus._M_p,0);
          uVar15 != 0xffffffffffffffff;
          uVar15 = std::__cxx11::string::find
                             ((char *)psVar1,(ulong)local_640._M_dataplus._M_p,uVar15 + 1)) {
        pcVar11 = (char *)std::__cxx11::string::find((char *)psVar1,0x178e52,uVar15);
        if (pcVar11 != (char *)0xffffffffffffffff) {
          pcVar19 = (char *)(local_640._M_string_length + uVar15);
          if (pcVar19 < pcVar11) {
            do {
              if ((0x20 < (ulong)(byte)pcVar19[(long)(psVar1->_M_dataplus)._M_p]) ||
                 ((0x100002400U >> ((ulong)(byte)pcVar19[(long)(psVar1->_M_dataplus)._M_p] & 0x3f) &
                  1) == 0)) goto LAB_0015ae9b;
              pcVar19 = pcVar19 + 1;
            } while (pcVar19 < pcVar11);
          }
          pcVar11 = pcVar11 + 2;
          pcVar19 = (char *)(this->m_BufferNoComment)._M_string_length;
          pos = pcVar11;
          if (pcVar11 < pcVar19) {
            do {
              pos = pcVar11;
              if ((0x20 < (ulong)(byte)pcVar11[(long)(psVar1->_M_dataplus)._M_p]) ||
                 ((0x100002400U >> ((ulong)(byte)pcVar11[(long)(psVar1->_M_dataplus)._M_p] & 0x3f) &
                  1) == 0)) break;
              pcVar11 = pcVar11 + 1;
              pos = pcVar19;
            } while (pcVar19 != pcVar11);
          }
          sVar13 = std::__cxx11::string::find((char *)psVar1,0x177d62,(ulong)pos);
          if (sVar13 != 0xffffffffffffffff) {
            local_600 = sVar13;
            std::__cxx11::string::substr((ulong)&local_660,(ulong)psVar1);
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"~","");
            std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_640._M_dataplus._M_p);
            lVar10 = GetLineNumber(this,(size_t)pos,true);
            GetLine_abi_cxx11_(&local_5d8,this,lVar10 - 1);
            __n = local_660._M_string_length;
            if (((local_660._M_string_length != local_640._M_string_length) ||
                (((char *)local_660._M_string_length != (char *)0x0 &&
                 (iVar9 = bcmp(local_660._M_dataplus._M_p,local_640._M_dataplus._M_p,
                               local_660._M_string_length), iVar9 != 0)))) &&
               (((__n != local_620._M_string_length ||
                 (((char *)__n != (char *)0x0 &&
                  (iVar9 = bcmp(local_660._M_dataplus._M_p,local_620._M_dataplus._M_p,__n),
                  iVar9 != 0)))) &&
                (lVar10 = std::__cxx11::string::find((char *)&local_5d8,0x178e55,0), lVar10 == -1)))
               ) {
              bVar6 = kwssys::RegularExpression::find
                                (&local_260,local_660._M_dataplus._M_p,&local_260.regmatch);
              if (!bVar6) {
                local_4b0 = (string  [8])local_4a0;
                local_4a8 = 0;
                local_4a0[0]._M_local_buf[0] = '\0';
                local_4c8._0_8_ = GetLineNumber(this,(size_t)pos,true);
                local_4c8._16_8_ = 0x1c;
                local_4c8._8_8_ = local_4c8._0_8_;
                std::operator+(&local_5b8,"function (",&local_660);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_5b8);
                psVar20 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar20) {
                  local_5f8.field_2._M_allocated_capacity = *psVar20;
                  local_5f8.field_2._8_8_ = plVar14[3];
                  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
                }
                else {
                  local_5f8.field_2._M_allocated_capacity = *psVar20;
                  local_5f8._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_5f8._M_string_length = plVar14[1];
                *plVar14 = (long)psVar20;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::__cxx11::string::operator=(local_4b0,(string *)&local_5f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
                  operator_delete(local_5f8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p);
                }
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)local_4c8);
                if (local_4b0 != (string  [8])local_4a0) {
                  operator_delete((void *)local_4b0);
                }
                bVar8 = 1;
              }
              if (maxLength != 0) {
                sVar13 = std::__cxx11::string::find((char *)psVar1,0x16acee,(ulong)pos);
                local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"");
                local_578 = sVar13;
                sVar13 = FindClosingChar(this,'{','}',sVar13,true,&local_548);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._M_dataplus._M_p != &local_548.field_2) {
                  operator_delete(local_548._M_dataplus._M_p);
                }
                lVar10 = GetLineNumber(this,local_578,false);
                lVar17 = GetLineNumber(this,sVar13,false);
                if ((sVar13 != 0xffffffffffffffff && local_578 != 0xffffffffffffffff) &&
                   (maxLength < (ulong)(lVar17 - lVar10))) {
                  local_4b0 = (string  [8])local_4a0;
                  local_4a8 = 0;
                  local_4a0[0]._M_local_buf[0] = '\0';
                  local_4c8._0_8_ = GetLineNumber(this,local_600,true);
                  local_4c8._16_8_ = 0x1d;
                  local_4c8._8_8_ = local_4c8._0_8_;
                  std::operator+(&local_5b8,"function (",&local_660);
                  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_5b8);
                  psVar20 = puVar18 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar18 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar20) {
                    local_5f8.field_2._M_allocated_capacity = *psVar20;
                    local_5f8.field_2._8_8_ = puVar18[3];
                    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
                  }
                  else {
                    local_5f8.field_2._M_allocated_capacity = *psVar20;
                    local_5f8._M_dataplus._M_p = (pointer)*puVar18;
                  }
                  local_5f8._M_string_length = puVar18[1];
                  *puVar18 = psVar20;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  std::__cxx11::string::operator=(local_4b0,(string *)&local_5f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
                    operator_delete(local_5f8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                    operator_delete(local_5b8._M_dataplus._M_p);
                  }
                  pcVar11 = (char *)operator_new__(10);
                  snprintf(pcVar11,10,"%zd",lVar17 - lVar10);
                  std::__cxx11::string::append((char *)local_4b0);
                  std::__cxx11::string::append((char *)local_4b0);
                  snprintf(pcVar11,10,"%ld",maxLength);
                  std::__cxx11::string::append((char *)local_4b0);
                  std::__cxx11::string::append((char *)local_4b0);
                  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                            (&this->m_ErrorList,(value_type *)local_4c8);
                  operator_delete__(pcVar11);
                  if (local_4b0 != (string  [8])local_4a0) {
                    operator_delete((void *)local_4b0);
                  }
                  bVar8 = 1;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
              operator_delete(local_5d8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_660._M_dataplus._M_p != &local_660.field_2) {
              operator_delete(local_660._M_dataplus._M_p);
            }
          }
        }
LAB_0015ae9b:
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p);
      }
      pbVar21 = local_570 + 1;
    } while (pbVar21 !=
             local_598.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar6 = (bool)(bVar8 ^ 1);
LAB_0015b321:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return bVar6;
}

Assistant:

bool Parser::CheckMemberFunctions(const char* regEx,unsigned long maxLength)
{
  m_TestsDone[MEMBERFUNCTION_REGEX] = true;
  m_TestsDescription[MEMBERFUNCTION_REGEX] = "Member functions should match regular expression: ";
  m_TestsDescription[MEMBERFUNCTION_REGEX] += regEx;

  if(maxLength>0)
    {
    m_TestsDone[MEMBERFUNCTION_LENGTH] = true;
    m_TestsDescription[MEMBERFUNCTION_LENGTH] = "Member functions must not exceed: ";
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += std::to_string(maxLength);
    m_TestsDescription[MEMBERFUNCTION_LENGTH] += " lines";
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // Construct the list of classnames to check
  std::vector<std::string> classes;

  // We first read the .h if any and not a .h file
  if(kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str()) != ".h")
    {
    std::string headerfile = kwssys::SystemTools::GetFilenamePath(m_Filename.c_str());
    //headerfile += "/";
    headerfile += kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
    headerfile += ".h";

    if(kwssys::SystemTools::FileExists(headerfile.c_str()))
      {
      // We open the file
      std::ifstream file;
      file.open(headerfile.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "Cannot open file: " << headerfile.c_str() << std::endl;
        return true;
        }

      file.seekg(0,std::ios::end);
      unsigned long fileSize = file.tellg();
      file.seekg(0,std::ios::beg);

      char* buf = new char[fileSize+1];
      file.read(buf,fileSize);
      buf[fileSize] = 0;
      std::string buffer(buf);
      buffer.resize(fileSize);
      delete [] buf;

      file.close();

      this->ConvertBufferToWindowsFileType(buffer);
      buffer = this->RemoveComments(buffer.c_str());

      size_t classpos = this->GetClassPosition(0,buffer);
      while(classpos!=std::string::npos)
        {
        std::string classname = this->FindPreviousWord(classpos,false,buffer);
        if(buffer[classpos-1] != ' '
          && m_BufferNoComment[classpos-1] != '\n')
          {
          classname = "";
          size_t i=classpos-1;
          while(i!=std::string::npos && buffer[i] != ' ')
            {
            classname = buffer[i]+classname;
            i--;
            }
          }
        classes.push_back(classname);
        classpos = this->GetClassPosition(classpos+1,buffer);
        }
      }
    }

  // Check the current file for any classes
  // And check the name of the current files
  size_t classpos = this->GetClassPosition(0);
  while(classpos!=std::string::npos)
    {
    size_t current;
    std::string memberFunction =
            this->FindMemberFunction(m_BufferNoComment,classpos,
                                     this->FindEndOfClass(classpos+1),current);

    std::string classname = this->FindPreviousWord(classpos);

    if(m_BufferNoComment[classpos-1] != ' '
      && m_BufferNoComment[classpos-1] != '\n'
      )
      {
      classname = "";
      size_t i=classpos-1;
      while(i!=std::string::npos && m_BufferNoComment[i] != ' ')
        {
        classname = m_BufferNoComment[i]+classname;
        i--;
        }
      }
    std::string destructor = "~";
    destructor += classname;

    while(current!=std::string::npos)
      {
      // if the member function is a constructor or destructor we ignore
      if(memberFunction != classname
        && memberFunction != destructor
        )
        {
        if(!regex.find(memberFunction))
          {
          Error error;
          error.line = this->GetLineNumber(current,true);
          error.line2 = error.line;
          error.number = MEMBERFUNCTION_REGEX;
          error.description = "member function (" + memberFunction + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasError = true;
          }

        // Check the size of the current memberFunction
        if(maxLength>0 && current!=std::string::npos)
          {
          size_t open = m_BufferNoComment.find("{",current);
          size_t semicolon = m_BufferNoComment.find(";",current);
          if(semicolon>open)
            {
            size_t close = this->FindClosingChar('{','}',open,true);
            size_t lopen = this->GetLineNumber(open);
            size_t lclose = this->GetLineNumber(close);
            if((open!=std::string::npos) && (close!=std::string::npos) && (lclose-lopen>maxLength))
              {
              Error error;
              error.line = this->GetLineNumber(current,true);
              error.line2 = error.line;
              error.number = MEMBERFUNCTION_LENGTH;
              error.description = "function (" + memberFunction + ") has too many lines: ";
              constexpr size_t length = 10;
              char* temp = new char[length];
              snprintf(temp,length,"%zd",lclose-lopen);
              error.description += temp;
              error.description += " (";
              snprintf(temp,length,"%ld",maxLength);
              error.description += temp;
              error.description += ")";
              m_ErrorList.push_back(error);
              hasError = true;
              delete [] temp;
              }
            }
          }
        }
      memberFunction = this->FindMemberFunction(m_BufferNoComment,current+1,this->FindEndOfClass(classpos+1),current);
      }
    classes.push_back(classname);
    classpos = this->GetClassPosition(classpos+1);
    }

  // Do the checking for the implementation file
  std::vector<std::string>::const_iterator it = classes.begin();
  while(it != classes.end())
    {
    std::string classname = (*it);

    // Search all the classname::
    size_t pos = m_BufferNoComment.find(classname,0);
    while(pos != std::string::npos)
      {
      // look for ::
      size_t pos2 = m_BufferNoComment.find("::",pos);
      bool valid = false;
      if(pos2 != std::string::npos)
        {
        valid = true;
        for(size_t i=pos+classname.size();i<pos2;i++)
          {
          if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\n' && m_BufferNoComment[i] != '\r')
            {
            valid = false;
            break;
            }
          }
        }

      // if we have a match we look for the name
      if(valid)
        {
        size_t i=pos2+2;
        while(i<m_BufferNoComment.size() &&
             (m_BufferNoComment[i] == ' '
             || m_BufferNoComment[i] == '\n'
             || m_BufferNoComment[i] == '\r'))
          {
          i++;
          }

       size_t pos3 = m_BufferNoComment.find("(",i);
       if(pos3 != std::string::npos)
         {
         std::string functionName = m_BufferNoComment.substr(i,pos3-i);
         std::string destructor = "~";
         destructor += classname;

         std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

         // if the member function is a constructor or destructor we ignore
         if(functionName != classname
           && functionName != destructor
           && functionLine.find("typedef ") == std::string::npos
           )
           {
           if(!regex.find(functionName))
             {
             Error error;
             error.line = this->GetLineNumber(i,true);
             error.line2 = error.line;
             error.number = MEMBERFUNCTION_REGEX;
             error.description = "function (" + functionName + ") doesn't match regular expression";
             m_ErrorList.push_back(error);
             hasError = true;
             }

           if(maxLength>0)
             {
             size_t open = m_BufferNoComment.find("{",i);
             size_t close = this->FindClosingChar('{','}',open,true);
             size_t lopen = this->GetLineNumber(open);
             size_t lclose = this->GetLineNumber(close);
             if((open!=std::string::npos) && (close!=std::string::npos)
                && (lclose-lopen>maxLength))
               {
               Error error;
               error.line = this->GetLineNumber(pos3,true);
               error.line2 = error.line;
               error.number = MEMBERFUNCTION_LENGTH;
               error.description = "function (" + functionName + ") has too many lines: ";
               constexpr size_t length = 10;
               char* temp = new char[length];
               snprintf(temp,length,"%zd",lclose-lopen);
               error.description += temp;
               error.description += " (";
               snprintf(temp,length,"%ld",maxLength);
               error.description += temp;
               error.description += ")";
               m_ErrorList.push_back(error);
               hasError = true;
               delete [] temp;
               }
             }
           }
         }
        }
      pos = m_BufferNoComment.find(classname,pos+1);
      }
    it++;
    }

  return !hasError;
}